

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O3

int cvcMain(int argc,char **argv)

{
  octet *buf1;
  char **ppcVar1;
  int iVar2;
  bool_t bVar3;
  err_t code;
  int iVar4;
  octet *poVar5;
  size_t sVar6;
  octet *privkey;
  char *pcVar7;
  octet *poVar8;
  octet *cert;
  size_t sVar9;
  btok_cvc_t *pbVar10;
  btok_cvc_t *pbVar11;
  long lVar12;
  octet date [6];
  int readc;
  size_t certa_len;
  size_t req_len;
  bool_t eid;
  btok_cvc_t *local_188;
  btok_cvc_t *local_180;
  btok_cvc_t *local_178;
  int readc_1;
  octet *local_168;
  int readc_2;
  bool_t esign;
  btok_cvc_t cvc0 [1];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  cvc root [options] <privkeya> <certa>\n    issue self-signed certificate <certa>\n  cvc req [options] <privkey> <req>\n    generate pre-certificate <req>\n  cvc iss [options] <privkeya> <certa> <req> <cert>\n    issue <cert> based on <req> and subordinate to <certa>\n  cvc shorten [options] <privkeya> <certa> <cert>\n    shorten the lifetime of <cert> subordinate to <certa>\n  cvc val [options] <certa> <certb> ... <cert>\n    validate <certb> ... <cert> using <certa> as an anchor\n  cvc match [options] <privkey> <cert>\n    check the match between <privkey> and <cert>\n  cvc extr <cert> <pubkey>\n    extract <pubkey> from <cert>\n  cvc print [field] <cert>\n    print <cert> info: all fields or a specific field\n  .\n  <privkey>, <privkeya>\n    containers with private keys\n  <pubkey>\n    file with public key\n  options:\n    -authority <name> -- authority       [root] req\n    -holder <name> -- holder             [root] req [iss]\n    -from <YYMMDD> -- starting date      root req [iss]\n    -until <YYMMDD> -- expiration date   root req [iss] cut\n    -eid <10*hex> -- eId access mask     [root] [req] [iss]\n    -esign <4*hex> -- eSign access mask  [root] [req] [iss]\n    -pass <schema> -- password           root req iss shorten match\n    -date <YYMMDD> -- validation date    [val]\n  field:\n    {-authority|-holder|-from|-until|-eid|-esign|-pubkey|-sig}\n"
           ,"cvc","manage CV-certificates");
    return -1;
  }
  iVar2 = strCmp(argv[1],"root");
  if (iVar2 == 0) {
    code = cmdStDo(8);
    if (code == 0) {
      code = cvcParseOptions(cvc0,(bool_t *)&req_len,&readc_1,(cmd_pwd_t *)date,(octet *)0x0,&eid,
                             argc + -2,argv + 2);
      if (code == 0) {
        if ((argc + -2) - eid != 2) goto LAB_001091ca;
        sVar6 = strLen(cvc0[0].authority);
        pcVar7 = cvc0[0].holder;
        if (sVar6 == 0) {
          pbVar11 = cvc0;
          pbVar10 = (btok_cvc_t *)pcVar7;
LAB_00109468:
          strCopy(pbVar11->authority,pbVar10->authority);
        }
        else {
          sVar6 = strLen(pcVar7);
          if (sVar6 == 0) {
            pbVar10 = cvc0;
            pbVar11 = (btok_cvc_t *)pcVar7;
            goto LAB_00109468;
          }
        }
        iVar2 = strCmp(cvc0[0].authority,pcVar7);
        if (iVar2 == 0) goto LAB_00108efe;
LAB_00109482:
        cmdPwdClose(_date);
        code = 0x135;
      }
    }
  }
  else {
    iVar2 = strCmp(argv[1],"req");
    if (iVar2 == 0) {
      code = cmdStDo(8);
      if (code == 0) {
        code = cvcParseOptions(cvc0,(bool_t *)&req_len,&readc_1,(cmd_pwd_t *)date,(octet *)0x0,&eid,
                               argc + -2,argv + 2);
        if (code == 0) {
          if ((argc + -2) - eid != 2) goto LAB_001091ca;
          iVar2 = strCmp(cvc0[0].authority,cvc0[0].holder);
          if (iVar2 == 0) goto LAB_00109482;
LAB_00108efe:
          ppcVar1 = argv + (long)eid + 2;
          code = cmdFileValExist(1,ppcVar1);
          if (code == 0) {
            code = cmdFileValNotExist(1,ppcVar1 + 1);
            if (code == 0) {
              _readc = 0;
              code = cmdPrivkeyRead((octet *)0x0,(size_t *)&readc,*ppcVar1,_date);
              if (code != 0) goto LAB_00108f54;
              privkey = (octet *)blobCreate(_readc);
              if (privkey == (octet *)0x0) {
LAB_0010969a:
                cmdPwdClose(_date);
LAB_001096a3:
                code = 0x6e;
              }
              else {
                code = cmdPrivkeyRead(privkey,(size_t *)0x0,*ppcVar1,_date);
                cmdPwdClose(_date);
                if ((code == 0) &&
                   (code = btokCVCWrap((octet *)0x0,&certa_len,cvc0,privkey,_readc), code == 0)) {
                  poVar5 = (octet *)blobCreate(certa_len);
                  poVar8 = privkey;
                  if (poVar5 == (octet *)0x0) {
LAB_00109705:
                    blobClose(poVar8);
                    goto LAB_001096a3;
                  }
                  code = btokCVCWrap(poVar5,(size_t *)0x0,cvc0,privkey,_readc);
                  blobClose(privkey);
                  privkey = poVar5;
                  if (code == 0) {
                    code = cmdFileWrite(ppcVar1[1],poVar5,certa_len);
                  }
                }
LAB_00109690:
                blobClose(privkey);
              }
            }
          }
        }
      }
    }
    else {
      iVar2 = strCmp(argv[1],"iss");
      if (iVar2 == 0) {
        code = cmdStDo(8);
        if (code == 0) {
          code = cvcParseOptions(cvc0,&eid,&esign,(cmd_pwd_t *)date,(octet *)0x0,&readc_2,argc + -2,
                                 argv + 2);
          if (code == 0) {
            sVar6 = strLen(cvc0[0].authority);
            if ((sVar6 != 0) || ((argc + -2) - readc_2 != 4)) goto LAB_001091ca;
            ppcVar1 = argv + 2 + readc_2;
            code = cmdFileValExist(3,ppcVar1);
            if (code != 0) goto LAB_001093e9;
            code = cmdFileValNotExist(1,ppcVar1 + 3);
            if (code != 0) goto LAB_001093e9;
            _readc = 0;
            code = cmdPrivkeyRead((octet *)0x0,(size_t *)&readc,*ppcVar1,_date);
            if (code == 0) {
              privkey = (octet *)blobCreate(_readc);
              if (privkey != (octet *)0x0) {
                code = cmdPrivkeyRead(privkey,(size_t *)0x0,*ppcVar1,_date);
                cmdPwdClose(_date);
                if (((code == 0) &&
                    (code = cmdFileReadAll((void *)0x0,&certa_len,ppcVar1[1]), code == 0)) &&
                   (code = cmdFileReadAll((void *)0x0,&req_len,ppcVar1[2]), sVar6 = req_len,
                   code == 0)) {
                  local_188 = (btok_cvc_t *)(req_len + 0x30);
                  _readc_1 = local_188;
                  poVar5 = (octet *)blobCreate(certa_len + req_len * 2 + 0x158);
                  poVar8 = privkey;
                  if (poVar5 != (octet *)0x0) {
                    local_178 = (btok_cvc_t *)certa_len;
                    local_180 = (btok_cvc_t *)req_len;
                    code = cmdFileReadAll(poVar5,&certa_len,ppcVar1[1]);
                    if (code == 0) {
                      poVar8 = poVar5 + (long)local_178;
                      code = cmdFileReadAll(poVar8,&req_len,ppcVar1[2]);
                      if (code == 0) {
                        local_168 = poVar8 + (long)local_180->authority;
                        pbVar11 = (btok_cvc_t *)(local_168 + (long)local_188->authority);
                        code = btokCVCUnwrap(pbVar11,poVar8,req_len,pbVar11->pubkey,0);
                        if (code == 0) {
                          sVar9 = strLen(cvc0[0].holder);
                          if (sVar9 != 0) {
                            strCopy(pbVar11->holder,cvc0[0].holder);
                          }
                          bVar3 = memIsZero(cvc0[0].from,6);
                          if (bVar3 == 0) {
                            memCopy(pbVar11->from,cvc0[0].from,6);
                          }
                          bVar3 = memIsZero(cvc0[0].until,6);
                          if (bVar3 == 0) {
                            memCopy(pbVar11->until,cvc0[0].until,6);
                          }
                          if (eid != 0) {
                            lVar12 = 0;
                            do {
                              (poVar5 + (long)(local_180->authority +
                                              (long)(local_178->authority + sVar6)))[lVar12 + 0xe4]
                                   = (poVar5 + (long)(local_180->authority +
                                                     (long)(local_178->authority + sVar6)))
                                     [lVar12 + 0xe4] & cvc0[0].hat_eid[lVar12];
                              lVar12 = lVar12 + 1;
                            } while (lVar12 != 5);
                          }
                          if (esign != 0) {
                            pbVar11->hat_esign[0] = pbVar11->hat_esign[0] & cvc0[0].hat_esign[0];
                            pbVar11->hat_esign[1] = pbVar11->hat_esign[1] & cvc0[0].hat_esign[1];
                          }
                          code = btokCVCIss(local_168,(size_t *)&readc_1,pbVar11,poVar5,certa_len,
                                            privkey,_readc);
                          blobClose(privkey);
                          privkey = poVar5;
                          if (code == 0) {
                            code = cmdFileWrite(ppcVar1[3],local_168,(size_t)_readc_1);
                          }
                          goto LAB_00109690;
                        }
                      }
                    }
                    blobClose(privkey);
                    privkey = poVar5;
                    goto LAB_00109690;
                  }
                  goto LAB_00109705;
                }
                goto LAB_00109690;
              }
              goto LAB_0010969a;
            }
LAB_00108f54:
            cmdPwdClose(_date);
          }
        }
      }
      else {
        iVar2 = strCmp(argv[1],"shorten");
        if (iVar2 == 0) {
          code = cmdStDo(8);
          if (code == 0) {
            code = cvcParseOptions(cvc0,(bool_t *)0x0,(bool_t *)0x0,(cmd_pwd_t *)date,(octet *)0x0,
                                   &readc_1,argc + -2,argv + 2);
            if (code == 0) {
              sVar6 = strLen(cvc0[0].authority);
              if (((sVar6 == 0) && (sVar6 = strLen(cvc0[0].holder), sVar6 == 0)) &&
                 (bVar3 = memIsZero(cvc0[0].from,6), bVar3 != 0)) {
                poVar5 = cvc0[0].until;
                bVar3 = memIsZero(poVar5,6);
                if (bVar3 == 0) {
                  if ((argc + -2) - readc_1 == 3) {
                    ppcVar1 = argv + 2 + readc_1;
                    code = cmdFileValExist(3,ppcVar1);
                    if (code == 0) {
                      _readc = 0;
                      code = cmdPrivkeyRead((octet *)0x0,(size_t *)&readc,*ppcVar1,_date);
                      if (code != 0) goto LAB_00108f54;
                      poVar8 = (octet *)blobCreate(_readc);
                      if (poVar8 == (octet *)0x0) goto LAB_0010969a;
                      code = cmdPrivkeyRead(poVar8,(size_t *)0x0,*ppcVar1,_date);
                      cmdPwdClose(_date);
                      privkey = poVar8;
                      if (((code == 0) &&
                          (code = cmdFileReadAll((void *)0x0,&certa_len,ppcVar1[1]), code == 0)) &&
                         (code = cmdFileReadAll((void *)0x0,&req_len,ppcVar1[2]), code == 0)) {
                        privkey = (octet *)blobCreate(certa_len + req_len + 0x128);
                        if (privkey == (octet *)0x0) goto LAB_00109705;
                        cert = privkey + certa_len;
                        local_188 = (btok_cvc_t *)(cert + req_len);
                        code = cmdFileReadAll(privkey,&certa_len,ppcVar1[1]);
                        if ((((code == 0) &&
                             (code = cmdFileReadAll(cert,&req_len,ppcVar1[2]), code == 0)) &&
                            (code = btokCVCVal(cert,req_len,privkey,certa_len,(octet *)0x0),
                            code == 0)) &&
                           (code = btokCVCUnwrap(local_188,cert,req_len,(octet *)0x0,0), code == 0))
                        {
                          buf1 = local_188->until;
                          iVar2 = memCmp(buf1,poVar5,6);
                          if (iVar2 < 0) {
                            blobClose(poVar8);
                            blobClose(privkey);
                            code = 0x134;
                            goto LAB_001093e9;
                          }
                          memCopy(buf1,poVar5,6);
                          code = btokCVCIss(cert,(size_t *)0x0,local_188,privkey,certa_len,poVar8,
                                            _readc);
                          blobClose(poVar8);
                          if (code == 0) {
                            code = cmdFileWrite(ppcVar1[2],cert,req_len);
                          }
                        }
                        else {
                          blobClose(poVar8);
                        }
                      }
                      goto LAB_00109690;
                    }
                    goto LAB_001093e9;
                  }
                }
              }
LAB_001091ca:
              cmdPwdClose(_date);
              code = 0x25b;
            }
          }
        }
        else {
          iVar2 = strCmp(argv[1],"val");
          if (iVar2 == 0) {
            code = cmdStDo(8);
            if (code == 0) {
              code = cvcParseOptions((btok_cvc_t *)0x0,(bool_t *)0x0,(bool_t *)0x0,(cmd_pwd_t *)0x0,
                                     date,&readc,argc + -2,argv + 2);
              if (code != 0) goto LAB_001093e9;
              iVar2 = readc;
              lVar12 = (long)readc;
              iVar4 = (argc + -2) - readc;
              code = 0x25b;
              if (iVar4 < 2) goto LAB_001093e9;
              ppcVar1 = argv + 2 + lVar12;
              code = cmdFileValExist(iVar4,ppcVar1);
              if (code != 0) goto LAB_001093e9;
              privkey = (octet *)blobCreate(0x450);
              if (privkey != (octet *)0x0) {
                code = cmdFileReadAll((void *)0x0,(size_t *)cvc0,*ppcVar1);
                if (code == 0) {
                  if ((ulong)cvc0[0].authority._0_8_ < 0x201) {
                    code = cmdFileReadAll(privkey,(size_t *)cvc0,*ppcVar1);
                    if (code == 0) {
                      local_178 = (btok_cvc_t *)(privkey + 0x200);
                      code = btokCVCUnwrap(local_178,privkey,cvc0[0].authority._0_8_,(octet *)0x0,0)
                      ;
                      pbVar11 = local_178;
                      if (code == 0) {
                        local_180 = (btok_cvc_t *)(privkey + 0x328);
                        local_168 = (octet *)((ulong)(uint)(argc - iVar2) - 4);
                        local_188 = (btok_cvc_t *)(argv + lVar12 + 3);
                        lVar12 = 0;
                        while (code = cmdFileReadAll((void *)0x0,(size_t *)cvc0,
                                                     *(char **)(local_188->authority + lVar12 * 8)),
                              code == 0) {
                          if (0x200 < (ulong)cvc0[0].authority._0_8_) goto LAB_001096ad;
                          code = cmdFileReadAll(privkey,(size_t *)cvc0,
                                                *(char **)(local_188->authority + lVar12 * 8));
                          if (code != 0) break;
                          if (((int)local_168 == (int)lVar12) &&
                             (bVar3 = memIsZero(date,6), bVar3 == 0)) {
                            code = btokCVCVal2(local_180,privkey,cvc0[0].authority._0_8_,local_178,
                                               date);
                            if (code == 0) {
                              memCopy(local_178,local_180,0x128);
                              code = 0;
                            }
                            break;
                          }
                          pbVar10 = local_180;
                          code = btokCVCVal2(local_180,privkey,cvc0[0].authority._0_8_,pbVar11,
                                             (octet *)0x0);
                          if (code != 0) break;
                          memCopy(pbVar11,pbVar10,0x128);
                          lVar12 = lVar12 + 1;
                          code = 0;
                          if ((argc - iVar2) - 3U == (int)lVar12) break;
                        }
                      }
                    }
                  }
                  else {
LAB_001096ad:
                    code = 0x202;
                  }
                }
                goto LAB_00109690;
              }
              goto LAB_001096a3;
            }
          }
          else {
            iVar2 = strCmp(argv[1],"match");
            if (iVar2 == 0) {
              code = cvcMatch(argc + -2,argv + 2);
            }
            else {
              iVar2 = strCmp(argv[1],"extr");
              if (iVar2 == 0) {
                code = cvcExtr(argc + -2,argv + 2);
              }
              else {
                iVar2 = strCmp(argv[1],"print");
                if (iVar2 != 0) {
                  code = 0x259;
                  iVar2 = -1;
                  goto LAB_001093f3;
                }
                code = cvcPrint(argc + -2,argv + 2);
              }
            }
          }
        }
      }
    }
  }
LAB_001093e9:
  iVar2 = -1;
  if (code == 0) {
    iVar2 = strCmp(argv[1],"val");
    if (iVar2 == 0) {
      iVar2 = 0;
      code = 0;
    }
    else {
      iVar4 = strCmp(argv[1],"match");
      iVar2 = 0;
      code = 0;
      if (iVar4 != 0) {
        return 0;
      }
    }
  }
LAB_001093f3:
  pcVar7 = errMsg(code);
  printf("bee2cmd/%s: %s\n","cvc",pcVar7);
  return iVar2;
}

Assistant:

int cvcMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return cvcUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "root"))
		code = cvcRoot(argc - 1, argv + 1);
	else if (strEq(argv[0], "req"))
		code = cvcReq(argc - 1, argv + 1);
	else if (strEq(argv[0], "iss"))
		code = cvcIss(argc - 1, argv + 1);
	else if (strEq(argv[0], "shorten"))
		code = cvcShorten(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = cvcVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "match"))
		code = cvcMatch(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = cvcExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = cvcPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val") || strEq(argv[0], "match"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}